

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

bool __thiscall SslTcpSocketImpl::SetConnectState(SslTcpSocketImpl *this)

{
  SslConnection *this_00;
  undefined8 __p;
  TcpSocketImpl *szFileName;
  _Any_data local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  SslTcpSocketImpl *local_20;
  
  std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslClientContext&>
            ((SslClientContext *)local_50);
  __p = local_50[0]._M_unused._0_8_;
  local_50[0]._M_unused._M_object = (void *)0x0;
  std::
  __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           *)&this->m_pSslCon,(pointer)__p);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)local_50);
  this_00 = (this->m_pSslCon)._M_t.
            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
            ._M_t.
            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  local_30._M_allocated_capacity = 0x11;
  local_30._8_8_ = 0;
  local_20 = this;
  std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslTcpSocketImpl*))()>,void>
            ((function<void()> *)local_50[0]._M_pod_data,
             (_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()> *)&local_30);
  OpenSSLWrapper::SslConnection::SetErrorCb(this_00,(function<void_()> *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,0,
             fnForwarder_abi_cxx11_);
  szFileName = (TcpSocketImpl *)0x1;
  OpenSSLWrapper::SslConnection::SetUserData
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,1,this);
  if ((this->m_strTrustRootCert)._M_string_length != 0) {
    szFileName = (TcpSocketImpl *)(this->m_strTrustRootCert)._M_dataplus._M_p;
    OpenSSLWrapper::SslConnection::SetTrustedRootCertificates
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
               (char *)szFileName);
  }
  ConEstablished(this,szFileName);
  return true;
}

Assistant:

bool SslTcpSocketImpl::SetConnectState()
{
    m_pSslCon = make_unique<SslConnection>(m_pClientCtx);
    m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));
    m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
    m_pSslCon->SetUserData(1, this);

    if (m_strTrustRootCert.size() > 0)
        m_pSslCon->SetTrustedRootCertificates(m_strTrustRootCert.c_str());

    ConEstablished(this);
    return true;
}